

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_parse_body(http_s *h)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FIOBJ FVar7;
  void *pvVar8;
  FIOBJ key;
  FIOBJ hash;
  void *pvVar9;
  char *pcVar10;
  char *pcVar11;
  ssize_t sVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  size_t __n;
  uint uVar16;
  size_t sVar17;
  long lVar18;
  char *start_at;
  bool bVar19;
  char *pcVar20;
  char *pcVar21;
  FIOBJ *pobj;
  char *pcVar22;
  char cVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *local_138;
  char *local_108;
  fio_str_info_s tmp;
  FIOBJ local_e0;
  char *local_d0;
  char *local_c0;
  char *local_98;
  size_t local_78;
  fio_str_info_s local_70;
  fio_str_info_s content_type;
  
  if (h->body == 0) {
    return -1;
  }
  if (http_parse_body::content_type_hash == 0) {
    http_parse_body::content_type_hash = fiobj_hash_string("content-type",0xc);
  }
  FVar7 = fiobj_hash_get2(h->headers,http_parse_body::content_type_hash);
  fiobj_obj2cstr(&content_type,FVar7);
  if (content_type.len < 0x10) {
    return -1;
  }
  if ((0x20 < content_type.len) &&
     (iVar4 = strncasecmp("application/x-www-form-urlencoded",content_type.data,0x21), iVar4 == 0))
  {
    if (h->params == 0) {
      FVar7 = fiobj_hash_new();
      h->params = FVar7;
    }
    FVar7 = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = FVar7;
    return 0;
  }
  iVar4 = strncasecmp("application/json",content_type.data,0x10);
  if (iVar4 == 0) {
    fiobj_obj2cstr(&tmp,h->body);
    content_type.data = tmp.data;
    content_type.capa = tmp.capa;
    content_type.len = tmp.len;
    if (h->params != 0) {
      return -1;
    }
    pobj = &h->params;
    sVar17 = fiobj_json2obj(pobj,tmp.data,tmp.len);
    if (sVar17 != 0) {
      FVar7 = *pobj;
      if (((uint)FVar7 & 7) != 4) {
        key = fiobj_str_new("JSON",4);
        hash = fiobj_hash_new2(4);
        *pobj = hash;
        fiobj_hash_set(hash,key,FVar7);
        fiobj_free(key);
        return 0;
      }
      return 0;
    }
    return -1;
  }
  iVar4 = strncasecmp("multipart/form",content_type.data,0xe);
  if (iVar4 != 0) {
    return -1;
  }
  pvVar8 = memchr(content_type.data,0x3b,content_type.len);
  pcVar20 = (char *)content_type.len;
  pcVar13 = content_type.data;
  while( true ) {
    if (pvVar8 == (void *)0x0) {
      return -1;
    }
    pcVar15 = (char *)0x0;
    while( true ) {
      if (pcVar13 + (long)(pcVar20 + ~(ulong)pvVar8) == pcVar15) {
        return -1;
      }
      if (pcVar15[(long)pvVar8 + 1] != ' ') break;
      pcVar15 = pcVar15 + 1;
    }
    pcVar21 = pcVar13 + (long)(pcVar20 + (~(ulong)pcVar15 - (long)pvVar8));
    if (pcVar21 < (char *)0xa) {
      return -1;
    }
    pcVar24 = (char *)((long)pvVar8 + (long)pcVar15) + 1;
    iVar4 = strncasecmp("boundary=",pcVar24,9);
    if (iVar4 == 0) break;
    pvVar8 = memchr(pcVar24,0x3b,(size_t)pcVar21);
    pcVar20 = pcVar21;
    pcVar13 = pcVar24;
  }
  pcVar24 = (char *)((long)pvVar8 + (long)pcVar15) + 10;
  pvVar9 = memchr(pcVar24,0x3b,
                  (size_t)(pcVar13 + (long)(pcVar20 + (-(long)pcVar15 - (long)pvVar8) + -10)));
  pcVar21 = (char *)((long)pvVar9 + (-(long)pcVar15 - (long)pvVar8) + -10);
  if (pvVar9 == (void *)0x0) {
    pcVar21 = pcVar13 + (long)(pcVar20 + (-(long)pcVar15 - (long)pvVar8) + -10);
  }
  if (h->params == 0) {
    FVar7 = fiobj_hash_new();
    h->params = FVar7;
  }
  pcVar20 = pcVar21 + 4;
  bVar3 = false;
  start_at = (char *)0x0;
  local_108 = (char *)0x0;
  local_138 = (char *)0x0;
  local_e0 = 0;
  pcVar13 = (char *)0x0;
  pcVar15 = (char *)0x0;
LAB_00141845:
  if (pcVar13 != (char *)0x0) {
    pcVar26 = pcVar15 + (long)pcVar13;
    bVar19 = !bVar3;
    lVar18 = (long)start_at - (long)pcVar15;
    pcVar10 = pcVar15;
LAB_00141882:
    pcVar22 = pcVar10;
    pcVar25 = pcVar10;
    if (bVar19) {
      bVar2 = true;
      if (pcVar20 <= pcVar13) {
        if ((*pcVar10 != '-') || (pcVar10[1] != '-')) {
          bVar19 = false;
          goto LAB_001421e7;
        }
        iVar4 = bcmp(pcVar10 + 2,pcVar24,(size_t)pcVar21);
        pcVar14 = local_138;
        if (iVar4 == 0) goto LAB_00141a57;
      }
      bVar19 = false;
    }
    else {
      do {
        pvVar8 = memchr(pcVar22,10,(long)pcVar26 - (long)pcVar22);
        if (pvVar8 == (void *)0x0) {
          if (pcVar26 != pcVar10) {
            if (local_108 == (char *)0x0) {
              local_108 = pcVar10 + lVar18;
            }
            local_138 = local_138 + (long)pcVar26 + -(long)pcVar10;
          }
          goto LAB_001421bf;
        }
        pcVar22 = (char *)((long)pvVar8 + 1);
      } while ((pcVar20 <= pcVar26 + -(long)pcVar22) &&
              (((*pcVar22 != '-' || (*(char *)((long)pvVar8 + 2) != '-')) ||
               (iVar4 = bcmp((void *)((long)pvVar8 + 3),pcVar24,(size_t)pcVar21), iVar4 != 0))));
      if ((char *)((long)pvVar8 + (long)(pcVar21 + 5)) < pcVar26) {
        pcVar14 = pcVar22 + (~(ulong)pcVar10 - 1);
        if ((pcVar10 + -1)[(long)(pcVar22 + ~(ulong)pcVar10)] != '\r') {
          pcVar14 = pcVar22 + ~(ulong)pcVar10;
        }
        pcVar25 = pcVar10 + lVar18;
        if (local_108 != (char *)0x0) {
          pcVar25 = local_108;
        }
        if (pcVar14 == (char *)0x0) {
          pcVar25 = local_108;
        }
        fiobj_obj2cstr(&tmp,local_e0);
        pcVar14 = pcVar14 + (long)local_138;
        if (pcVar14 != (char *)0x0) {
          if (pcVar14 < (char *)0x2a) {
            FVar7 = fiobj_str_new(pcVar25 + (long)pcVar15,(size_t)pcVar14);
          }
          else {
            FVar7 = fiobj_data_slice(h->body,(intptr_t)pcVar25,(uintptr_t)pcVar14);
          }
          http_add2hash2(h->params,tmp.data,tmp.len,FVar7,'\0');
          fiobj_free(local_e0);
          pcVar25 = (char *)0x0;
          local_e0 = 0;
        }
        bVar3 = false;
        pcVar10 = pcVar22;
        local_108 = pcVar25;
LAB_00141a57:
        bVar19 = (bool)(bVar19 ^ 1);
        pcVar25 = pcVar10;
        do {
          local_138 = pcVar14;
          if (pcVar26 <= pcVar25) goto LAB_001422ba;
          if (pcVar25[(long)(pcVar21 + 2)] == '-') {
            cVar23 = pcVar25[(long)(pcVar21 + 3)];
            if (cVar23 == '-') {
              pcVar25 = pcVar25 + (long)(pcVar21 + 5);
              if (pcVar26 < pcVar25) {
                bVar2 = false;
                pcVar25 = pcVar26;
              }
              else if (pcVar25 < pcVar26) {
                bVar2 = false;
                pcVar25 = pcVar25 + (*pcVar25 == '\n');
              }
              else {
                bVar2 = false;
              }
              goto LAB_00142173;
            }
          }
          else {
            cVar23 = pcVar25[(long)(pcVar21 + 3)];
          }
          pcVar22 = pcVar25 + (long)(pcVar21 + (ulong)(cVar23 == '\n') + 3);
          local_d0 = (char *)0x0;
          local_78 = 0;
          local_c0 = (char *)0x0;
          sVar17 = 0;
          local_98 = (char *)0x0;
          uVar6 = 0;
          cVar23 = '\0';
          while (pcVar22 + 4 < pcVar26) {
            if ((*pcVar22 == '\n') || (pcVar22[1] == '\n')) {
              if (local_d0 == (char *)0x0) goto LAB_00142178;
              goto LAB_00141dcd;
            }
            pcVar10 = (char *)memchr(pcVar22,10,(long)pcVar26 - (long)pcVar22);
            if (pcVar10 == (char *)0x0) goto LAB_001421e7;
            if ((long)pcVar10 - (long)pcVar22 < 0x1e) {
              if (0xe < (long)pcVar10 - (long)pcVar22) goto LAB_00141d1f;
            }
            else {
              iVar4 = strncasecmp(pcVar22,"content-disposition:",0x14);
              if (iVar4 == 0) {
                pcVar22 = pcVar22 + 0x14;
                do {
                  pvVar8 = memchr(pcVar22,0x3b,(long)pcVar10 - (long)pcVar22);
                  while( true ) {
                    while( true ) {
                      if (pvVar8 == (void *)0x0) goto LAB_00141d96;
                      pcVar22 = (char *)((long)pvVar8 + 1);
                      if (*(char *)((long)pvVar8 + 1) == ' ') {
                        pcVar22 = (char *)((long)pvVar8 + 2);
                      }
                      if ((pcVar10 <= pcVar22 + 6) ||
                         (iVar4 = strncasecmp(pcVar22,"name=",5), iVar4 != 0)) break;
                      local_d0 = pcVar22 + 5;
                      if (pcVar22[5] == '\"') {
                        local_d0 = pcVar22 + 6;
                      }
                      pvVar8 = memchr(local_d0,0x3b,(long)pcVar10 - (long)pcVar22);
                      if (pvVar8 == (void *)0x0) {
                        iVar4 = (int)pcVar10 - (int)local_d0;
                        uVar16 = iVar4 - (uint)(local_d0[iVar4 - 1] == '\r');
                      }
                      else {
                        uVar16 = (int)pvVar8 - (int)local_d0;
                      }
                      if (local_d0[uVar16 - 1] == '\"') {
                        uVar16 = uVar16 - 1;
                      }
                      local_78 = (size_t)uVar16;
                    }
                    if ((pcVar10 <= pcVar22 + 9) ||
                       (iVar4 = strncasecmp(pcVar22,"filename",8), iVar4 != 0)) break;
                    cVar1 = pcVar22[8];
                    pcVar11 = pcVar22 + 8;
                    if (cVar1 == '*') {
                      pcVar11 = pcVar22 + 9;
                    }
                    if (pcVar22[(ulong)(cVar1 == '*') + 8] != '=') goto LAB_00142178;
                    pcVar22 = pcVar11 + 1;
                    if (pcVar11[1] == ' ') {
                      pcVar22 = pcVar11 + 2;
                    }
                    pcVar22 = pcVar22 + (pcVar11[(ulong)(pcVar11[1] == ' ') + 1] == '\"');
                    __n = (long)pcVar10 - (long)pcVar22;
                    if ((local_c0 == (char *)0x0) || (cVar1 == '*')) {
                      pvVar8 = memchr(pcVar22,0x3b,__n);
                      if (pvVar8 == (void *)0x0) {
                        uVar16 = (int)__n - (uint)(pcVar22[(int)__n - 1] == '\r');
                      }
                      else {
                        uVar16 = (int)pvVar8 - (int)pcVar22;
                      }
                      if (pcVar22[uVar16 - 1] == '\"') {
                        uVar16 = uVar16 - 1;
                      }
                      sVar17 = (size_t)uVar16;
                      local_c0 = pcVar22;
                      if (cVar1 == '*') {
                        sVar12 = http_decode_url(pcVar22,pcVar22,sVar17);
                        uVar5 = (uint)sVar12;
                        if (sVar12 < 1) {
                          uVar5 = uVar16;
                        }
                        sVar17 = (size_t)uVar5;
                      }
                    }
                    else {
                      pvVar8 = memchr(local_c0,0x3b,__n);
                    }
                  }
                } while( true );
              }
LAB_00141d1f:
              iVar4 = strncasecmp(pcVar22,"content-type:",0xd);
              if (iVar4 == 0) {
                local_98 = pcVar22 + 0xd;
                if (pcVar22[0xd] == ' ') {
                  local_98 = pcVar22 + 0xe;
                }
                pvVar8 = memchr(local_98,0x3b,(long)pcVar10 - (long)local_98);
                if (pvVar8 == (void *)0x0) {
                  iVar4 = (int)((long)pcVar10 - (long)local_98);
                  uVar6 = iVar4 - (uint)(local_98[iVar4 - 1] == '\r');
                }
                else {
                  uVar6 = (int)pvVar8 - (int)local_98;
                }
              }
            }
LAB_00141d96:
            pcVar22 = pcVar10 + 1;
            cVar23 = cVar23 + '\x01';
            if (cVar23 == '\x06') {
LAB_00142178:
              bVar19 = false;
              goto LAB_001421e7;
            }
          }
          if (local_d0 == (char *)0x0) goto LAB_001422ba;
LAB_00141dcd:
          pcVar11 = pcVar22 + 1;
          pcVar10 = pcVar22 + 1;
          if (pcVar22[1] == '\n') {
            pcVar11 = pcVar22 + 2;
            pcVar10 = pcVar22 + 2;
          }
          do {
            pvVar8 = memchr(pcVar11,10,(long)pcVar26 - (long)pcVar11);
            local_138._0_4_ = (int)sVar17;
            if (pvVar8 == (void *)0x0) goto LAB_0014201f;
            pcVar11 = (char *)((long)pvVar8 + 1);
          } while ((pcVar20 <= pcVar26 + -(long)pcVar11) &&
                  (((*pcVar11 != '-' || (*(char *)((long)pvVar8 + 2) != '-')) ||
                   (iVar4 = bcmp((void *)((long)pvVar8 + 3),pcVar24,(size_t)pcVar21), iVar4 != 0))))
          ;
          if (pcVar26 <= (char *)((long)pvVar8 + (long)(pcVar21 + 5))) goto LAB_0014201f;
          pcVar22 = pcVar11 + ~(ulong)pcVar10;
          uVar16 = (uint)pcVar22;
          if (pcVar10[(ulong)(pcVar22 + 0xffffffff) & 0xffffffff] == '\r') {
            uVar16 = (uint)(pcVar22 + 0xffffffff);
          }
          if ((int)local_138 == 0) {
            http_add2hash(h->params,local_d0,local_78,pcVar10,(ulong)uVar16,'\0');
          }
          else {
            FVar7 = fiobj_str_new(local_d0,local_78);
            fiobj_str_write(FVar7,"[data]",6);
            fiobj_obj2cstr(&tmp,FVar7);
            http_add2hash(h->params,tmp.data,tmp.len,pcVar10,(ulong)uVar16,'\0');
            fiobj_str_resize(FVar7,local_78);
            fiobj_str_write(FVar7,"[name]",6);
            fiobj_obj2cstr(&local_70,FVar7);
            tmp.data = local_70.data;
            tmp.capa = local_70.capa;
            tmp.len = local_70.len;
            http_add2hash(h->params,local_70.data,local_70.len,local_c0,sVar17,'\0');
            if (uVar6 != 0) {
              fiobj_str_resize(FVar7,local_78);
              fiobj_str_write(FVar7,"[type]",6);
              fiobj_obj2cstr(&local_70,FVar7);
              tmp.data = local_70.data;
              tmp.capa = local_70.capa;
              tmp.len = local_70.len;
              http_add2hash(h->params,local_70.data,local_70.len,local_98,(ulong)uVar6,'\0');
            }
            fiobj_free(FVar7);
          }
          bVar19 = true;
          pcVar25 = pcVar11;
        } while( true );
      }
      pcVar26 = (char *)((long)pvVar8 - 2);
      if (*(char *)((long)pvVar8 + -1) != '\r') {
        pcVar26 = (char *)((long)pvVar8 - 1);
      }
      if (pcVar26 == pcVar10) {
        bVar19 = true;
      }
      else {
        if (local_108 == (char *)0x0) {
          local_108 = pcVar10 + lVar18;
        }
        local_138 = pcVar26 + ((long)local_138 - (long)pcVar10);
LAB_001421bf:
        bVar19 = true;
        pcVar25 = pcVar26;
      }
LAB_001421e7:
      bVar2 = true;
      pcVar10 = pcVar25;
    }
    goto LAB_001421ec;
  }
  bVar2 = true;
  pcVar25 = pcVar15;
  goto LAB_00142173;
LAB_0014201f:
  if (bVar19) goto LAB_001422ba;
  local_e0 = fiobj_str_new(local_d0,local_78);
  bVar3 = true;
  local_108 = (char *)0x0;
  local_138 = (char *)0x0;
  bVar19 = false;
  if (local_c0 != (char *)0x0) {
    fiobj_str_write(local_e0,"[type]",6);
    fiobj_obj2cstr(&tmp,local_e0);
    local_108 = (char *)0x0;
    http_add2hash(h->params,tmp.data,tmp.len,local_98,(ulong)uVar6,'\0');
    fiobj_str_resize(local_e0,local_78);
    fiobj_str_write(local_e0,"[name]",6);
    fiobj_obj2cstr(&local_70,local_e0);
    tmp.data = local_70.data;
    tmp.capa = local_70.capa;
    tmp.len = local_70.len;
    http_add2hash(h->params,local_70.data,local_70.len,local_c0,sVar17,'\0');
    fiobj_str_resize(local_e0,local_78);
    fiobj_str_write(local_e0,"[data]",6);
    local_138 = (char *)0x0;
    bVar19 = false;
  }
  goto LAB_00141882;
LAB_001422ba:
  bVar2 = true;
LAB_00142173:
  bVar19 = true;
  pcVar10 = pcVar25;
LAB_001421ec:
  start_at = pcVar10 + ((long)start_at - (long)pcVar15);
  fiobj_data_pread(&tmp,h->body,(intptr_t)start_at,0x1000);
  if (((!bVar19) || (!bVar2)) ||
     (pcVar13 = (char *)tmp.len, pcVar15 = tmp.data, tmp.data == (char *)0x0)) {
    fiobj_free(local_e0);
    return 0;
  }
  goto LAB_00141845;
}

Assistant:

int http_parse_body(http_s *h) {
  static uint64_t content_type_hash;
  if (!h->body)
    return -1;
  if (!content_type_hash)
    content_type_hash = fiobj_hash_string("content-type", 12);
  FIOBJ ct = fiobj_hash_get2(h->headers, content_type_hash);
  fio_str_info_s content_type = fiobj_obj2cstr(ct);
  if (content_type.len < 16)
    return -1;
  if (content_type.len >= 33 &&
      !strncasecmp("application/x-www-form-urlencoded", content_type.data,
                   33)) {
    if (!h->params)
      h->params = fiobj_hash_new();
    FIOBJ tmp = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = tmp;
    return 0;
  }
  if (content_type.len >= 16 &&
      !strncasecmp("application/json", content_type.data, 16)) {
    content_type = fiobj_obj2cstr(h->body);
    if (h->params)
      return -1;
    if (fiobj_json2obj(&h->params, content_type.data, content_type.len) == 0)
      return -1;
    if (FIOBJ_TYPE_IS(h->params, FIOBJ_T_HASH))
      return 0;
    FIOBJ tmp = h->params;
    FIOBJ key = fiobj_str_new("JSON", 4);
    h->params = fiobj_hash_new2(4);
    fiobj_hash_set(h->params, key, tmp);
    fiobj_free(key);
    return 0;
  }

  http_fio_mime_s p = {.h = h};
  if (http_mime_parser_init(&p.p, content_type.data, content_type.len))
    return -1;
  if (!h->params)
    h->params = fiobj_hash_new();

  do {
    size_t cons = http_mime_parse(&p.p, p.buffer.data, p.buffer.len);
    p.pos += cons;
    p.buffer = fiobj_data_pread(h->body, p.pos, 4096);
  } while (p.buffer.data && !p.p.done && !p.p.error);
  fiobj_free(p.partial_name);
  p.partial_name = FIOBJ_INVALID;
  return 0;
}